

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_io.c
# Opt level: O3

cfg_db * cfg_io_load(cfg_instance *instance,char *url,autobuf *log)

{
  cfg_io *pcVar1;
  cfg_db *pcVar2;
  char *fmt;
  char *io_param;
  char *local_18;
  
  local_18 = (char *)0x0;
  pcVar1 = _find_io(instance,url,&local_18,log);
  if (pcVar1 == (cfg_io *)0x0) {
    fmt = "Error, unknown config io \'%s\'.";
  }
  else {
    if (pcVar1->load != (_func_cfg_db_ptr_char_ptr_autobuf_ptr *)0x0) {
      pcVar2 = (*pcVar1->load)(local_18,log);
      return pcVar2;
    }
    url = pcVar1->name;
    fmt = "Error, config io \'%s\' does not support loading.";
  }
  cfg_append_printable_line(log,fmt,url);
  return (cfg_db *)0x0;
}

Assistant:

struct cfg_db *
cfg_io_load(struct cfg_instance *instance, const char *url, struct autobuf *log) {
  struct cfg_io *io;
  const char *io_param = NULL;

  io = _find_io(instance, url, &io_param, log);
  if (io == NULL) {
    cfg_append_printable_line(log, "Error, unknown config io '%s'.", url);
    return NULL;
  }

  if (io->load == NULL) {
    cfg_append_printable_line(log, "Error, config io '%s' does not support loading.", io->name);
    return NULL;
  }
  return io->load(io_param, log);
}